

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O1

void door_handling_interior(tgestate_t *state,vischar_t *vischar)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  int iVar4;
  doorindex_t *pdVar5;
  byte bVar6;
  ulong uVar7;
  ulong uVar8;
  
  bVar6 = state->interior_doors[0];
  if (bVar6 != 0xff) {
    bVar1 = vischar->direction;
    pdVar5 = state->interior_doors;
    do {
      pdVar5 = pdVar5 + 1;
      state->current_door = bVar6;
      uVar7 = (ulong)(bVar6 >> 5 & 4);
      bVar2 = (&doors[(ulong)(bVar6 & 0x7f) * 2].room_and_direction)[uVar7];
      if (((((bVar1 ^ bVar2) & 3) == 0) &&
          (uVar8 = (ulong)(bVar6 & 0x7f), bVar6 = (&doors[uVar8 * 2].mappos.u)[uVar7],
          uVar3 = (state->saved_mappos).pos16.u,
          uVar3 <= (ushort)(bVar6 + 3) && (int)(bVar6 - 3) < (int)(uint)uVar3)) &&
         (bVar6 = (&doors[uVar8 * 2].mappos.v)[uVar7], uVar3 = (state->saved_mappos).pos16.v,
         uVar3 <= (ushort)(bVar6 + 3) && (int)(bVar6 - 3) < (int)(uint)uVar3)) {
        iVar4 = is_door_locked(state);
        if (iVar4 != 0) {
          return;
        }
        vischar->room = bVar2 >> 2;
        transition(state,(mappos8_t *)
                         ((long)doors +
                         (ulong)(-1 < (char)state->current_door) * 8 + uVar7 + uVar8 * 8 + -3));
        return;
      }
      bVar6 = *pdVar5;
    } while (bVar6 != 0xff);
  }
  return;
}

Assistant:

void door_handling_interior(tgestate_t *state, vischar_t *vischar)
{
  doorindex_t     *pdoors;         /* was HL */
  doorindex_t      current_door;   /* was A */
  uint8_t          room_and_flags; /* was A */
  const door_t    *door;           /* was HL' */
  const mappos8_t *doormappos;     /* was HL' */
  mappos16_t      *mappos;         /* was DE' */
  uint8_t          u;              /* was A */
  uint8_t          v;              /* was A */

  assert(state != NULL);
  ASSERT_VISCHAR_VALID(vischar);

  for (pdoors = &state->interior_doors[0]; ; pdoors++)
  {
    current_door = *pdoors;
    if (current_door == interiordoor_NONE)
      return; /* Reached end of list. */

    state->current_door = current_door;

    door = get_door(current_door);
    room_and_flags = door->room_and_direction;

    /* Does the character face the same direction as the door? */
    if ((vischar->direction & vischar_DIRECTION_MASK) != (room_and_flags & door_FLAGS_MASK_DIRECTION))
      continue;

    /* Skip any door which is more than three units away. */
    doormappos = &door->mappos;
    mappos = &state->saved_mappos.pos16; // reusing saved_mappos as 8-bit here? a case for saved_mappos being a union of pos8 and pos types?
    u = doormappos->u;
    if (u - 3 >= mappos->u || u + 3 < mappos->u) // -3 .. +2
      continue;
    v = doormappos->v;
    if (v - 3 >= mappos->v || v + 3 < mappos->v) // -3 .. +2
      continue;

    if (is_door_locked(state))
      return; /* The door was locked. */

    vischar->room = room_and_flags >> 2;

    doormappos = &door[1].mappos;
    if (state->current_door & door_REVERSE)
      doormappos = &door[-1].mappos;

    transition(state, doormappos); /* was tail call */
    NEVER_RETURNS; // check
  }
}